

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O3

void __thiscall Liby::http::HttpServer::handleAcceptEvent(HttpServer *this,Connection *conn)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  HttpContext *pHVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  HttpContext *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_28 = (HttpContext *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HttpContext,std::allocator<HttpContext>>
            (a_Stack_20,&local_28,(allocator<HttpContext> *)&local_29);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pHVar1 = local_28;
  local_28 = (HttpContext *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pHVar1->super_BaseContext;
  (conn->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return;
}

Assistant:

void HttpServer::handleAcceptEvent(Connection &conn) {
    conn.context_ = std::make_shared<HttpContext>();
}